

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

void luaL_requiref(lua_State *L,char *modname,lua_CFunction openf,int glb)

{
  lua_pushcclosure(L,openf,0);
  lua_pushstring(L,modname);
  lua_callk(L,1,1,0,(lua_CFunction)0x0);
  luaL_getsubtable(L,-0xf4628,"_LOADED");
  lua_pushvalue(L,-2);
  lua_setfield(L,-2,modname);
  lua_settop(L,-2);
  if (glb != 0) {
    lua_pushvalue(L,-1);
    lua_setglobal(L,modname);
    return;
  }
  return;
}

Assistant:

LUALIB_API void luaL_requiref (lua_State *L, const char *modname,
                               lua_CFunction openf, int glb) {
  lua_pushcfunction(L, openf);
  lua_pushstring(L, modname);  /* argument to open function */
  lua_call(L, 1, 1);  /* open module */
  luaL_getsubtable(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_pushvalue(L, -2);  /* make copy of module (call result) */
  lua_setfield(L, -2, modname);  /* _LOADED[modname] = module */
  lua_pop(L, 1);  /* remove _LOADED table */
  if (glb) {
    lua_pushvalue(L, -1);  /* copy of 'mod' */
    lua_setglobal(L, modname);  /* _G[modname] = module */
  }
}